

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O0

void __thiscall sc_dt::sc_uint_base::invalid_range(sc_uint_base *this,int l,int r)

{
  ostream *poVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  stringstream msg;
  string local_1c8 [44];
  int in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  sc_severity in_stack_fffffffffffffe84;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe68);
  poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe78,"sc_uint[_base] part selection: ");
  poVar1 = std::operator<<(poVar1,"left = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1,", right = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  poVar1 = std::operator<<(poVar1," violates ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x10) + -1);
  std::operator<<(poVar1," >= left >= right >= 0");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  sc_core::sc_report_handler::report
            (in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  std::__cxx11::string::~string(local_1c8);
  sc_core::sc_abort();
}

Assistant:

void
sc_uint_base::invalid_range( int l, int r ) const
{
    std::stringstream msg;
    msg << "sc_uint[_base] part selection: "
        << "left = " << l << ", right = " << r << " violates "
        << (m_len-1) << " >= left >= right >= 0";
    SC_REPORT_ERROR( sc_core::SC_ID_OUT_OF_BOUNDS_, msg.str().c_str() );
    sc_core::sc_abort(); // can't recover from here
}